

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_tt_GetGlyphHMetrics
               (nk_tt_fontinfo *info,int glyph_index,int *advanceWidth,int *leftSideBearing)

{
  nk_ushort nVar1;
  nk_short nVar2;
  nk_ushort numOfLongHorMetrics;
  int *leftSideBearing_local;
  int *advanceWidth_local;
  int glyph_index_local;
  nk_tt_fontinfo *info_local;
  
  nVar1 = nk_ttUSHORT(info->data + (long)info->hhea + 0x22);
  if (glyph_index < (int)(uint)nVar1) {
    if (advanceWidth != (int *)0x0) {
      nVar2 = nk_ttSHORT(info->data + (long)(glyph_index << 2) + (long)info->hmtx);
      *advanceWidth = (int)nVar2;
    }
    if (leftSideBearing != (int *)0x0) {
      nVar2 = nk_ttSHORT(info->data + (long)(glyph_index << 2) + (long)info->hmtx + 2);
      *leftSideBearing = (int)nVar2;
    }
  }
  else {
    if (advanceWidth != (int *)0x0) {
      nVar2 = nk_ttSHORT(info->data + (long)(int)((nVar1 - 1) * 4) + (long)info->hmtx);
      *advanceWidth = (int)nVar2;
    }
    if (leftSideBearing != (int *)0x0) {
      nVar2 = nk_ttSHORT(info->data +
                         (long)(int)((glyph_index - (uint)nVar1) * 2) +
                         (long)(int)((uint)nVar1 << 2) + (long)info->hmtx);
      *leftSideBearing = (int)nVar2;
    }
  }
  return;
}

Assistant:

NK_INTERN void
nk_tt_GetGlyphHMetrics(const struct nk_tt_fontinfo *info, int glyph_index,
    int *advanceWidth, int *leftSideBearing)
{
    nk_ushort numOfLongHorMetrics = nk_ttUSHORT(info->data+info->hhea + 34);
    if (glyph_index < numOfLongHorMetrics) {
        if (advanceWidth)
            *advanceWidth    = nk_ttSHORT(info->data + info->hmtx + 4*glyph_index);
        if (leftSideBearing)
            *leftSideBearing = nk_ttSHORT(info->data + info->hmtx + 4*glyph_index + 2);
    } else {
        if (advanceWidth)
            *advanceWidth    = nk_ttSHORT(info->data + info->hmtx + 4*(numOfLongHorMetrics-1));
        if (leftSideBearing)
            *leftSideBearing = nk_ttSHORT(info->data + info->hmtx + 4*numOfLongHorMetrics + 2*(glyph_index - numOfLongHorMetrics));
    }
}